

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_server.cpp
# Opt level: O0

bool __thiscall AutoReconnectConnection::disconnected(AutoReconnectConnection *this,bool imm)

{
  ostream *poVar1;
  bool imm_local;
  AutoReconnectConnection *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"minibus disconnected");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&this->delay);
  poVar1 = std::operator<<((ostream *)&std::cout,"reconnecting");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return true;
}

Assistant:

bool disconnected(bool imm) override {
    std::cout << "minibus disconnected" << std::endl;
    std::this_thread::sleep_for(delay);
    std::cout << "reconnecting" << std::endl;
    return true;
  }